

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmalloc.c
# Opt level: O1

void * hmalloc(size_t size)

{
  void *pvVar1;
  
  pvVar1 = malloc(size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  if (mem_panic == 0) {
    mem_panic = 1;
  }
  exit(1);
}

Assistant:

void *hmalloc(size_t size) {
    void *p;
    if (!(p = malloc(size))) {
        if (mem_panic) exit(1);
        mem_panic = 1;
        exit(1);
    }

    return p;
}